

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O2

int poptBitsChk(poptBits bits,char *s)

{
  ulong uVar1;
  size_t size;
  int iVar2;
  long lVar3;
  uint32_t h1;
  uint32_t h0;
  
  if (s == (char *)0x0) {
    size = 0;
  }
  else {
    size = strlen(s);
  }
  _h1 = 0;
  if (size == 0 || bits == (poptBits)0x0) {
    iVar2 = -0x14;
  }
  else {
    poptJlu32lpair(s,size,&h0,&h1);
    lVar3 = (ulong)_poptBitsK + 1;
    iVar2 = 0;
    do {
      lVar3 = lVar3 + -1;
      if (lVar3 == 0) {
        return 1;
      }
      uVar1 = (ulong)h0;
      h0 = h0 + h1;
    } while ((bits[uVar1 % (ulong)_poptBitsM >> 5].bits[0] >>
              ((uint)(uVar1 % (ulong)_poptBitsM) & 0x1f) & 1) != 0);
  }
  return iVar2;
}

Assistant:

int poptBitsChk(poptBits bits, const char * s)
{
    size_t ns = (s ? strlen(s) : 0);
    uint32_t h0 = 0;
    uint32_t h1 = 0;
    int rc = 1;

    if (bits == NULL || ns == 0)
	return POPT_ERROR_NULLARG;

    poptJlu32lpair(s, ns, &h0, &h1);

    for (ns = 0; ns < (size_t)_poptBitsK; ns++) {
        uint32_t h = h0 + ns * h1;
        uint32_t ix = (h % _poptBitsM);
        if (PBM_ISSET(ix, bits))
            continue;
        rc = 0;
        break;
    }
    return rc;
}